

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeVLD2DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar1 = MCInst_getOpcode(Inst);
  if (0x11 < uVar1 - 0x39d) {
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar3]);
    uVar1 = Insn & 0xf;
    if (uVar1 != 0xf) {
      MCOperand_CreateImm0(Inst,0);
    }
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn >> 0x10 & 0xf]);
    MCOperand_CreateImm0
              (Inst,(ulong)(uint)((int)(Insn << 0x1b) >> 0x1f & 2 << ((byte)(Insn >> 6) & 3)));
    if ((uVar1 | 2) != 0xf) {
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
    }
    return MCDisassembler_Success;
  }
  lVar4 = 0;
  if ((0x71c7U >> (uVar1 - 0x39d & 0x1f) & 1) != 0) {
    if (uVar3 != 0x1f) {
      MCOperand_CreateReg0(Inst,(uint)DPairDecoderTable[uVar3]);
      lVar4 = 3;
    }
    DVar2 = (*(code *)((long)&DAT_001d49f0 + (long)(int)(&DAT_001d49f0)[lVar4]))();
    return DVar2;
  }
  if (uVar3 < 0x1e) {
    MCOperand_CreateReg0(Inst,(uint)DPairSpacedDecoderTable[uVar3]);
    lVar4 = 3;
  }
  DVar2 = (*(code *)((long)&DAT_001d49e0 + (long)(int)(&DAT_001d49e0)[lVar4]))();
  return DVar2;
}

Assistant:

static DecodeStatus DecodeVLD2DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, align, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	align = fieldFromInstruction_4(Insn, 4, 1);
	size = 1 << fieldFromInstruction_4(Insn, 6, 2);
	align *= 2*size;

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD2DUPd16: case ARM_VLD2DUPd32: case ARM_VLD2DUPd8:
		case ARM_VLD2DUPd16wb_fixed: case ARM_VLD2DUPd16wb_register:
		case ARM_VLD2DUPd32wb_fixed: case ARM_VLD2DUPd32wb_register:
		case ARM_VLD2DUPd8wb_fixed: case ARM_VLD2DUPd8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2DUPd16x2: case ARM_VLD2DUPd32x2: case ARM_VLD2DUPd8x2:
		case ARM_VLD2DUPd16x2wb_fixed: case ARM_VLD2DUPd16x2wb_register:
		case ARM_VLD2DUPd32x2wb_fixed: case ARM_VLD2DUPd32x2wb_register:
		case ARM_VLD2DUPd8x2wb_fixed: case ARM_VLD2DUPd8x2wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
	}

	if (Rm != 0xF)
		MCOperand_CreateImm0(Inst, 0);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	if (Rm != 0xD && Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}